

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semiintersect_iterator.hpp
# Opt level: O0

void __thiscall
burst::
semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::integer_range<int>_*,_std::vector<boost::integer_range<int>,_std::allocator<boost::integer_range<int>_>_>_>,_std::less<void>_>
::drop_empty_range(semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::integer_range<int>_*,_std::vector<boost::integer_range<int>,_std::allocator<boost::integer_range<int>_>_>_>,_std::less<void>_>
                   *this,outer_range_iterator empty_range)

{
  size_t sVar1;
  __normal_iterator<boost::integer_range<int>_*,_std::vector<boost::integer_range<int>,_std::allocator<boost::integer_range<int>_>_>_>
  __middle;
  semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::integer_range<int>_*,_std::vector<boost::integer_range<int>,_std::allocator<boost::integer_range<int>_>_>_>,_std::less<void>_>
  *this_local;
  outer_range_iterator empty_range_local;
  
  sVar1 = range_count(this);
  if (this->m_min_items < sVar1) {
    __middle = std::
               next<__gnu_cxx::__normal_iterator<boost::integer_range<int>*,std::vector<boost::integer_range<int>,std::allocator<boost::integer_range<int>>>>>
                         ((__normal_iterator<boost::integer_range<int>_*,_std::vector<boost::integer_range<int>,_std::allocator<boost::integer_range<int>_>_>_>
                           )empty_range._M_current,1);
    std::_V2::
    rotate<__gnu_cxx::__normal_iterator<boost::integer_range<int>*,std::vector<boost::integer_range<int>,std::allocator<boost::integer_range<int>>>>>
              ((__normal_iterator<boost::integer_range<int>_*,_std::vector<boost::integer_range<int>,_std::allocator<boost::integer_range<int>_>_>_>
                )empty_range._M_current,__middle,(this->m_end)._M_current);
    __gnu_cxx::
    __normal_iterator<boost::integer_range<int>_*,_std::vector<boost::integer_range<int>,_std::allocator<boost::integer_range<int>_>_>_>
    ::operator--(&this->m_end);
    maintain_invariant(this);
  }
  else {
    scroll_to_end(this);
  }
  return;
}

Assistant:

void drop_empty_range (outer_range_iterator empty_range)
        {
            if (range_count() > m_min_items)
            {
                std::rotate(empty_range, std::next(empty_range), m_end);
                --m_end;

                maintain_invariant();
            }
            else
            {
                scroll_to_end();
            }
        }